

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondaryOperationalData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SecondaryOperationalData::Encode
          (SecondaryOperationalData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  SecondaryOperationalData *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8Param1);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Param2);
  KDataStream::operator<<(pKVar1,this->m_ui16NumFundParamSets);
  return;
}

Assistant:

void SecondaryOperationalData::Encode( KDataStream & stream ) const
{
    stream << m_ui8Param1
           << m_ui8Param2
           << m_ui16NumFundParamSets;
}